

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void setLedState(GPIOClass *pledPin,string *new_state)

{
  string *in_RSI;
  string *in_stack_00000230;
  GPIOClass *in_stack_00000238;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30,in_RSI);
  GPIOClass::setval_gpio(in_stack_00000238,in_stack_00000230);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void setLedState(GPIOClass* pledPin, const string new_state)
{
    pledPin->setval_gpio(new_state);
}